

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_fork_test.cpp
# Opt level: O0

int post_callback_test(metacall_pid pid,void *ctx)

{
  ostream *this;
  void *this_00;
  int in_EDI;
  
  this = std::operator<<((ostream *)&std::cout,"MetaCall post fork callback test ");
  this_00 = (void *)std::ostream::operator<<(this,in_EDI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  post_callback_fired = 1;
  return 0;
}

Assistant:

int post_callback_test(metacall_pid pid, void *ctx)
{
	(void)ctx;

	std::cout << "MetaCall post fork callback test " << (int)pid << std::endl;

	post_callback_fired = 1;

	return 0;
}